

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O1

void ptm_mgau_reset_fast_hist(ps_mgau_t *ps)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  _func_int_ps_mgau_t_ptr_int16_ptr_uint8_ptr_int32_mfcc_t_ptr_ptr_int32_int32 *__s;
  int iVar6;
  long lVar7;
  ptm_mgau_t *s;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  if (0 < *(int *)&ps[6].vt) {
    lVar10 = 0;
    do {
      pcVar5 = (char *)__ckd_calloc_3d__((long)*(int *)(*(long *)&ps[1].frame_idx + 0x20),
                                         (long)*(int *)(*(long *)&ps[1].frame_idx + 0x24),
                                         (long)(short)ps[4].frame_idx,8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                         ,0x30b);
      (&(ps[5].vt)->name)[lVar10 * 2] = pcVar5;
      iVar2 = *(int *)(*(long *)&ps[1].frame_idx + 0x20);
      if (0 < (long)iVar2) {
        uVar3 = *(uint *)(*(long *)&ps[1].frame_idx + 0x24);
        lVar7 = 0;
        do {
          if (0 < (int)uVar3) {
            sVar1 = (short)ps[4].frame_idx;
            uVar8 = 0;
            do {
              if (0 < sVar1) {
                lVar4 = *(long *)(*(long *)(pcVar5 + lVar7 * 8) + uVar8 * 8);
                lVar9 = 0;
                do {
                  *(int *)(lVar4 + lVar9 * 8) = (int)lVar9;
                  *(undefined4 *)(lVar4 + 4 + lVar9 * 8) = 0x80000000;
                  lVar9 = lVar9 + 1;
                } while (sVar1 != lVar9);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != uVar3);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar2);
      }
      iVar6 = iVar2 + 0x3e;
      if (-1 < iVar2 + 0x1f) {
        iVar6 = iVar2 + 0x1f;
      }
      __s = (_func_int_ps_mgau_t_ptr_int16_ptr_uint8_ptr_int32_mfcc_t_ptr_ptr_int32_int32 *)
            __ckd_calloc__((long)(iVar6 >> 5),4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                           ,0x317);
      (&(ps[5].vt)->frame_eval)[lVar10 * 2] = __s;
      iVar6 = *(int *)(*(long *)&ps[1].frame_idx + 0x20);
      iVar2 = iVar6 + 0x1f;
      iVar6 = iVar6 + 0x3e;
      if (-1 < iVar2) {
        iVar6 = iVar2;
      }
      memset(__s,0xff,(long)(iVar6 >> 5) << 2);
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)&ps[6].vt);
  }
  return;
}

Assistant:

void
ptm_mgau_reset_fast_hist(ps_mgau_t *ps)
{
    ptm_mgau_t *s = (ptm_mgau_t *)ps;
    int i;

    for (i = 0; i < s->n_fast_hist; ++i) {
        int j, k, m;
        /* Top-N codewords for every codebook and feature. */
        s->hist[i].topn = ckd_calloc_3d(s->g->n_mgau, s->g->n_feat,
                                        s->max_topn, sizeof(ptm_topn_t));
        /* Initialize them to sane (yet arbitrary) defaults. */
        for (j = 0; j < s->g->n_mgau; ++j) {
            for (k = 0; k < s->g->n_feat; ++k) {
                for (m = 0; m < s->max_topn; ++m) {
                    s->hist[i].topn[j][k][m].cw = m;
                    s->hist[i].topn[j][k][m].score = WORST_DIST;
                }
            }
        }
        /* Active codebook mapping (just codebook, not features,
           at least not yet) */
        s->hist[i].mgau_active = bitvec_alloc(s->g->n_mgau);
        /* Start with them all on, prune them later. */
        bitvec_set_all(s->hist[i].mgau_active, s->g->n_mgau);
    }
}